

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
llvm::SmallVectorImpl<llvm::DWARFDebugMacro::Entry>::emplace_back<>
          (SmallVectorImpl<llvm::DWARFDebugMacro::Entry> *this)

{
  size_t sVar1;
  size_t sVar2;
  iterator __s;
  reference pEVar3;
  SmallVectorImpl<llvm::DWARFDebugMacro::Entry> *this_local;
  
  sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
  sVar2 = SmallVectorBase::capacity((SmallVectorBase *)this);
  if (sVar2 <= sVar1) {
    SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>::grow
              (&this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>,0);
  }
  __s = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::end
                  ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)this);
  memset(__s,0,0x18);
  sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar1 + 1);
  pEVar3 = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::back
                     ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)this);
  return pEVar3;
}

Assistant:

reference emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
    return this->back();
  }